

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

void InternalEndCurrentThreadWrapper(void *arg)

{
  CPalThread *pThread;
  void *arg_local;
  
  pthread_setspecific(CorUnix::thObjKey,arg);
  LOADCallDllMain(3,(LPVOID)0x0);
  CorUnix::InternalEndCurrentThread((CPalThread *)arg);
  pthread_setspecific(CorUnix::thObjKey,(void *)0x0);
  return;
}

Assistant:

static void InternalEndCurrentThreadWrapper(void *arg)
{
    CPalThread *pThread = (CPalThread *) arg;

    // When pthread_exit calls us, it has already removed the PAL thread
    // from TLS.  Since InternalEndCurrentThread calls functions that assert
    // that the current thread is known to this PAL, and that pThread
    // actually is the current PAL thread, put it back in TLS temporarily.
    pthread_setspecific(thObjKey, pThread);

    /* Call entry point functions of every attached modules to
       indicate the thread is exiting */
    /* note : no need to enter a critical section for serialization, the loader
       will lock its own critical section */
    LOADCallDllMain(DLL_THREAD_DETACH, NULL);

    // PAL_Leave will be called just before we release the thread reference
    // in InternalEndCurrentThread.
    InternalEndCurrentThread(pThread);
    pthread_setspecific(thObjKey, NULL);
}